

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix2f.cpp
# Opt level: O1

Matrix2f operator*(Matrix2f *x,Matrix2f *y)

{
  float fVar1;
  Matrix2f *product;
  undefined8 *in_RDI;
  long lVar2;
  float *pfVar3;
  long lVar4;
  int k;
  long lVar5;
  bool bVar6;
  Matrix2f MVar7;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  lVar2 = 0;
  do {
    pfVar3 = y->m_elements;
    lVar4 = 0;
    do {
      fVar1 = x->m_elements[lVar2 + lVar4 * 2];
      lVar5 = 0;
      do {
        MVar7.m_elements[2] = pfVar3[lVar5 * 2] * fVar1 + *(float *)(in_RDI + lVar5);
        *(float *)(in_RDI + lVar5) = MVar7.m_elements[2];
        lVar5 = lVar5 + 1;
      } while (lVar5 == 1);
      pfVar3 = pfVar3 + 1;
      bVar6 = lVar4 == 0;
      lVar4 = lVar4 + 1;
    } while (bVar6);
    in_RDI = (undefined8 *)((long)in_RDI + 4);
    bVar6 = lVar2 == 0;
    lVar2 = lVar2 + 1;
  } while (bVar6);
  MVar7.m_elements[1] = 0.0;
  MVar7.m_elements[0] = fVar1;
  MVar7.m_elements[3] = 0.0;
  return (Matrix2f)MVar7.m_elements;
}

Assistant:

Matrix2f operator * ( const Matrix2f& x, const Matrix2f& y )
{
	Matrix2f product; // zeroes

	for( int i = 0; i < 2; ++i )
	{
		for( int j = 0; j < 2; ++j )
		{
			for( int k = 0; k < 2; ++k )
			{
				product( i, k ) += x( i, j ) * y( j, k );
			}
		}
	}

	return product;
}